

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O0

bool bhf::ads::PrependUdpTag(Frame *frame,string *value,uint16_t tagId)

{
  string *this;
  unsigned_short uVar1;
  short sVar2;
  long lVar3;
  ostream *poVar4;
  void *pvVar5;
  string local_1e0 [6];
  uint16_t length;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [382];
  uint16_t local_22;
  string *psStack_20;
  uint16_t tagId_local;
  string *value_local;
  Frame *frame_local;
  
  local_22 = tagId;
  psStack_20 = value;
  value_local = (string *)frame;
  lVar3 = std::__cxx11::string::length();
  uVar1 = std::numeric_limits<unsigned_short>::max();
  if ((ulong)uVar1 < lVar3 + 1U) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,"PrependUdpTag");
    poVar4 = std::operator<<(poVar4,"(): value is too long, skipping tagId (");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,local_22);
    std::operator<<(poVar4,")\n");
    std::__cxx11::stringstream::str();
    Logger::Log(2,local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    frame_local._7_1_ = false;
  }
  else {
    sVar2 = std::__cxx11::string::length();
    this = value_local;
    pvVar5 = (void *)std::__cxx11::string::data();
    Frame::prepend((Frame *)this,pvVar5,(ulong)(ushort)(sVar2 + 1U));
    frame_local._7_1_ = PrependUdpLenTagId((Frame *)value_local,sVar2 + 1U,local_22);
  }
  return frame_local._7_1_;
}

Assistant:

static bool PrependUdpTag(Frame& frame, const std::string& value, const uint16_t tagId)
{
    if (value.length() + 1 > std::numeric_limits<uint16_t>::max()) {
        LOG_WARN(__FUNCTION__ << "(): value is too long, skipping tagId (" << std::dec << tagId << ")\n");
        return false;
    }
    const auto length = static_cast<uint16_t>(value.length() + 1);
    frame.prepend(value.data(), length);
    return PrependUdpLenTagId(frame, length, tagId);
}